

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RowSetClear(void *pArg)

{
  RowSetChunk *pRVar1;
  RowSetChunk *pNextChunk;
  RowSetChunk *pChunk;
  RowSet *p;
  void *pArg_local;
  
  pNextChunk = *pArg;
  while (pNextChunk != (RowSetChunk *)0x0) {
    pRVar1 = pNextChunk->pNextChunk;
    sqlite3DbFree(*(sqlite3 **)((long)pArg + 8),pNextChunk);
    pNextChunk = pRVar1;
  }
  *(undefined8 *)pArg = 0;
  *(undefined2 *)((long)pArg + 0x30) = 0;
  *(undefined8 *)((long)pArg + 0x10) = 0;
  *(undefined8 *)((long)pArg + 0x18) = 0;
  *(undefined8 *)((long)pArg + 0x28) = 0;
  *(undefined2 *)((long)pArg + 0x32) = 1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RowSetClear(void *pArg){
  RowSet *p = (RowSet*)pArg;
  struct RowSetChunk *pChunk, *pNextChunk;
  for(pChunk=p->pChunk; pChunk; pChunk = pNextChunk){
    pNextChunk = pChunk->pNextChunk;
    sqlite3DbFree(p->db, pChunk);
  }
  p->pChunk = 0;
  p->nFresh = 0;
  p->pEntry = 0;
  p->pLast = 0;
  p->pForest = 0;
  p->rsFlags = ROWSET_SORTED;
}